

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_block.h
# Opt level: O0

string * __thiscall
google::protobuf::internal::StringBlock::AtOffset_abi_cxx11_(StringBlock *this,size_t offset)

{
  size_t t;
  LogMessage *pLVar1;
  undefined1 auVar2 [16];
  LogMessageFatal local_48 [23];
  Voidify local_31;
  unsigned_long local_30;
  unsigned_long local_28;
  string *local_20;
  string *absl_log_internal_check_op_result;
  size_t offset_local;
  StringBlock *this_local;
  
  absl_log_internal_check_op_result = (string *)offset;
  offset_local = (size_t)this;
  local_28 = absl::lts_20240722::log_internal::GetReferenceableValue(offset);
  t = effective_size(this);
  local_30 = absl::lts_20240722::log_internal::GetReferenceableValue(t);
  local_20 = absl::lts_20240722::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_28,&local_30,"offset <= effective_size()");
  if (local_20 != (string *)0x0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_20);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/string_block.h"
               ,0xa2,auVar2._0_8_,auVar2._8_8_);
    pLVar1 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_48);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_31,pLVar1);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_48);
  }
  return (string *)(&absl_log_internal_check_op_result->_M_dataplus + (long)&this[1].next_);
}

Assistant:

ABSL_ATTRIBUTE_RETURNS_NONNULL inline std::string* StringBlock::AtOffset(
    size_t offset) {
  ABSL_DCHECK_LE(offset, effective_size());
  return reinterpret_cast<std::string*>(reinterpret_cast<char*>(this + 1) +
                                        offset);
}